

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
          (DefineTextureFromImage *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,
          SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,bool useSync,bool serverSync)

{
  Texture *pTVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_58;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48 [2];
  undefined1 local_22;
  undefined1 local_21;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *pSStack_20;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  DefineTextureFromImage *this_local;
  
  local_22 = serverSync;
  local_21 = useSync;
  pSStack_20 = image;
  image_local = (SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this;
  Operation::Operation(&this->super_Operation,"DefineTextureFromImage",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DefineTextureFromImage_03267a88;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr(&this->m_image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>
            (local_48,image);
  Operation::readGLObject(&this->super_Operation,local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>
            (&local_58,texture);
  Operation::modifyGLObject(&this->super_Operation,&local_58);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(&local_58);
  pTVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(texture);
  pTVar1->isDefined = true;
  pTVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&pTVar1->sourceImage,image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&this->m_image,image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=(&this->m_texture,texture);
  return;
}

Assistant:

DefineTextureFromImage::DefineTextureFromImage (SharedPtr<Texture> texture, SharedPtr<EGLImage> image, bool useSync, bool serverSync)
	: Operation	("DefineTextureFromImage", useSync, serverSync)
{
	readGLObject(SharedPtr<Object>(image));
	modifyGLObject(SharedPtr<Object>(texture));

	texture->isDefined		= true;
	texture->sourceImage	= image;

	m_image		= image;
	m_texture	= texture;
}